

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptProxy::GetValueFromDescriptor
          (JavascriptProxy *this,Var instance,PropertyDescriptor *propertyDescriptor,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  RecyclableObject *function;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  ScriptContext *requestContext_local;
  PropertyDescriptor *propertyDescriptor_local;
  Var instance_local;
  JavascriptProxy *this_local;
  
  bVar2 = PropertyDescriptor::ValueSpecified(propertyDescriptor);
  if (bVar2) {
    pvVar3 = PropertyDescriptor::GetValue(propertyDescriptor);
    this_local = (JavascriptProxy *)CrossSite::MarshalVar(requestContext,pvVar3,false);
  }
  else {
    bVar2 = PropertyDescriptor::GetterSpecified(propertyDescriptor);
    if (bVar2) {
      pvVar3 = PropertyDescriptor::GetGetter(propertyDescriptor);
      function = VarTo<Js::RecyclableObject>(pvVar3);
      this_local = (JavascriptProxy *)
                   Js::JavascriptOperators::CallGetter(function,instance,requestContext);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x7ce,"(0)","FALSE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      this_00 = ScriptContext::GetLibrary(requestContext);
      this_local = (JavascriptProxy *)
                   JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    }
  }
  return this_local;
}

Assistant:

Var JavascriptProxy::GetValueFromDescriptor(Var instance, PropertyDescriptor propertyDescriptor, ScriptContext* requestContext)
    {
        if (propertyDescriptor.ValueSpecified())
        {
            return CrossSite::MarshalVar(requestContext, propertyDescriptor.GetValue());
        }
        if (propertyDescriptor.GetterSpecified())
        {
            return JavascriptOperators::CallGetter(VarTo<RecyclableObject>(propertyDescriptor.GetGetter()), instance, requestContext);
        }
        Assert(FALSE);
        return requestContext->GetLibrary()->GetUndefined();
    }